

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCryptoProvider.cc
# Opt level: O0

shared_ptr<QPDFCryptoImpl> QPDFCryptoProvider::getImpl(void)

{
  string *name;
  ulong uVar1;
  logic_error *this;
  QPDFCryptoProvider *in_RDI;
  shared_ptr<QPDFCryptoImpl> sVar2;
  QPDFCryptoProvider *p;
  
  name = (string *)getInstance();
  std::__shared_ptr_access<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)name);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__shared_ptr_access<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)name);
    sVar2 = getImpl_internal(in_RDI,name);
    sVar2.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)in_RDI;
    return (shared_ptr<QPDFCryptoImpl>)
           sVar2.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"QPDFCryptoProvider::getImpl called with no default provider.")
  ;
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::shared_ptr<QPDFCryptoImpl>
QPDFCryptoProvider::getImpl()
{
    QPDFCryptoProvider& p = getInstance();
    if (p.m->default_provider.empty()) {
        throw std::logic_error("QPDFCryptoProvider::getImpl called with no default provider.");
    }
    return p.getImpl_internal(p.m->default_provider);
}